

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O3

size_t __thiscall websocketpp::http::parser::request::consume(request *this,char *buf,size_t len)

{
  size_t *psVar1;
  ulong uVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  char *pcVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  pointer pcVar7;
  const_iterator cVar8;
  size_t sVar9;
  exception *peVar10;
  _Base_ptr p_Var11;
  element_type *peVar12;
  ptrdiff_t _Num;
  size_t __n;
  iterator begin;
  key_type local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  if (this->m_ready == false) {
    if ((this->super_parser).m_body_bytes_needed == 0) {
      local_78 = buf;
      std::__cxx11::string::append
                ((char *)(this->m_buf).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(ulong)buf);
      peVar12 = (this->m_buf).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      begin._M_current = (peVar12->_M_dataplus)._M_p;
      end = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (begin._M_current,begin._M_current + peVar12->_M_string_length,"\r\n","");
      __n = (long)end._M_current - (long)begin._M_current;
      uVar2 = (this->super_parser).m_header_bytes + 3 + __n;
      (this->super_parser).m_header_bytes = uVar2;
      if (16000 < uVar2) {
LAB_001a0c96:
        peVar10 = (exception *)__cxa_allocate_exception(0x70);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Maximum header size exceeded.","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_50._M_string_length = 0;
        local_70._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_70.field_2._M_local_buf[0] = '\0';
        exception::exception(peVar10,&local_98,request_header_fields_too_large,&local_50,&local_70);
        __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
      }
      peVar12 = (this->m_buf).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar7 = (peVar12->_M_dataplus)._M_p;
      if (end._M_current != pcVar7 + peVar12->_M_string_length) {
        do {
          sVar3 = (this->m_method)._M_string_length;
          if (end._M_current == begin._M_current) {
            if (sVar3 != 0) {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Host","");
              cVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&(this->super_parser).m_headers._M_t,&local_98);
              p_Var11 = (_Base_ptr)&empty_header_abi_cxx11_;
              if ((_Rb_tree_header *)cVar8._M_node !=
                  &(this->super_parser).m_headers._M_t._M_impl.super__Rb_tree_header) {
                p_Var11 = cVar8._M_node + 2;
              }
              p_Var4 = p_Var11->_M_parent;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
              if (p_Var4 != (_Base_ptr)0x0) {
                peVar12 = (this->m_buf).
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                this_00 = (this->m_buf).
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                pcVar7 = (peVar12->_M_dataplus)._M_p;
                sVar3 = peVar12->_M_string_length;
                (this->m_buf).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                (this->m_buf).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                pcVar6 = end._M_current + (len - (long)(pcVar7 + sVar3)) + 2;
                bVar5 = parser::prepare_body(&this->super_parser);
                if (!bVar5) goto LAB_001a0a5d;
                sVar9 = parser::process_body
                                  (&this->super_parser,local_78 + (long)pcVar6,len - (long)pcVar6);
                pcVar6 = pcVar6 + sVar9;
                goto LAB_001a0a52;
              }
            }
            peVar10 = (exception *)__cxa_allocate_exception(0x70);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"Incomplete Request","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            local_50._M_string_length = 0;
            local_70._M_string_length = 0;
            local_50.field_2._M_local_buf[0] = '\0';
            local_70.field_2._M_local_buf[0] = '\0';
            exception::exception(peVar10,&local_98,bad_request,&local_50,&local_70);
            __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
          }
          if (sVar3 == 0) {
            process(this,begin,(iterator)end._M_current);
          }
          else {
            parser::process_header(&this->super_parser,begin,(iterator)end._M_current);
          }
          peVar12 = (this->m_buf).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          begin._M_current = end._M_current + 2;
          end = std::
                __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (begin._M_current,(peVar12->_M_dataplus)._M_p + peVar12->_M_string_length,
                           "\r\n","");
          __n = (long)end._M_current - (long)begin._M_current;
          uVar2 = (this->super_parser).m_header_bytes + 3 + __n;
          (this->super_parser).m_header_bytes = uVar2;
          if (16000 < uVar2) goto LAB_001a0c96;
          peVar12 = (this->m_buf).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          pcVar7 = (peVar12->_M_dataplus)._M_p;
        } while (end._M_current != pcVar7 + peVar12->_M_string_length);
      }
      if (end._M_current != begin._M_current) {
        memmove(pcVar7,begin._M_current,__n);
        peVar12 = (this->m_buf).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      }
      std::__cxx11::string::resize((ulong)peVar12,(char)__n);
      psVar1 = &(this->super_parser).m_header_bytes;
      *psVar1 = *psVar1 - ((this->m_buf).
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_M_string_length;
    }
    else {
      pcVar6 = (char *)parser::process_body(&this->super_parser,buf,len);
LAB_001a0a52:
      len = (size_t)pcVar6;
      if ((this->super_parser).m_body_bytes_needed == 0) {
LAB_001a0a5d:
        this->m_ready = true;
        len = (size_t)pcVar6;
      }
    }
  }
  else {
    len = (size_t)(char *)0x0;
  }
  return (size_t)(char *)len;
}

Assistant:

inline size_t request::consume(char const * buf, size_t len) {
    size_t bytes_processed;
    
    if (m_ready) {return 0;}
    
    if (m_body_bytes_needed > 0) {
        bytes_processed = process_body(buf,len);
        if (body_ready()) {
            m_ready = true;
        }
        return bytes_processed;
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end;

    for (;;) {
        // search for line delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter+sizeof(header_delimiter)-1
        );
        
        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.
        if (end-begin == 0) {
            // we got a blank line
            if (m_method.empty() || get_header("Host").empty()) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            bytes_processed = (
                len - static_cast<std::string::size_type>(m_buf->end()-end)
                    + sizeof(header_delimiter) - 1
            );

            // frees memory used temporarily during request parsing
            m_buf.reset();

            // if this was not an upgrade request and has a content length
            // continue capturing content-length bytes and expose them as a 
            // request body.
            
            if (prepare_body()) {
                bytes_processed += process_body(buf+bytes_processed,len-bytes_processed);
                if (body_ready()) {
                    m_ready = true;
                }
                return bytes_processed;
            } else {
                m_ready = true;

                // return number of bytes processed (starting bytes - bytes left)
                return bytes_processed;
            }
        } else {
            if (m_method.empty()) {
                this->process(begin,end);
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter)-1);
    }
}